

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecal.cpp
# Opt level: O0

void icu_63::CECalendar::jdToCE
               (int32_t julianDay,int32_t jdEpochOffset,int32_t *year,int32_t *month,int32_t *day)

{
  int32_t iVar1;
  int local_3c;
  int local_30;
  int32_t doy;
  int32_t r4;
  int32_t c4;
  int32_t *day_local;
  int32_t *month_local;
  int32_t *year_local;
  int32_t jdEpochOffset_local;
  int32_t julianDay_local;
  
  _r4 = day;
  day_local = month;
  month_local = year;
  year_local._0_4_ = jdEpochOffset;
  year_local._4_4_ = julianDay;
  iVar1 = ClockMath::floorDivide((double)(julianDay - jdEpochOffset),0x5b5,&local_30);
  *month_local = iVar1 * 4 + (local_30 / 0x16d - local_30 / 0x5b4);
  if (local_30 == 0x5b4) {
    local_3c = 0x16d;
  }
  else {
    local_3c = local_30 % 0x16d;
  }
  *day_local = local_3c / 0x1e;
  *_r4 = local_3c % 0x1e + 1;
  return;
}

Assistant:

void
CECalendar::jdToCE(int32_t julianDay, int32_t jdEpochOffset, int32_t& year, int32_t& month, int32_t& day)
{
    int32_t c4; // number of 4 year cycle (1461 days)
    int32_t r4; // remainder of 4 year cycle, always positive

    c4 = ClockMath::floorDivide(julianDay - jdEpochOffset, 1461, r4);

    year = 4 * c4 + (r4/365 - r4/1460); // 4 * <number of 4year cycle> + <years within the last cycle>

    int32_t doy = (r4 == 1460) ? 365 : (r4 % 365); // days in present year

    month = doy / 30;       // 30 -> Coptic/Ethiopic month length up to 12th month
    day = (doy % 30) + 1;   // 1-based days in a month
}